

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Option<Catch::SectionTracking::TestCaseTracker>::reset
          (Option<Catch::SectionTracking::TestCaseTracker> *this)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    SectionTracking::TestCaseTracker::~TestCaseTracker((TestCaseTracker *)0x25c1e6);
  }
  *in_RDI = 0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = NULL;
        }